

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3SrcListLookup(Parse *pParse,SrcList *pSrc)

{
  int iVar1;
  Table *local_28;
  Table *pTab;
  SrcList_item *pItem;
  SrcList *pSrc_local;
  Parse *pParse_local;
  
  local_28 = sqlite3LocateTableItem(pParse,0,pSrc->a);
  sqlite3DeleteTable(pParse->db,pSrc->a[0].pTab);
  pSrc->a[0].pTab = local_28;
  if (local_28 != (Table *)0x0) {
    local_28->nTabRef = local_28->nTabRef + 1;
  }
  iVar1 = sqlite3IndexedByLookup(pParse,pSrc->a);
  if (iVar1 != 0) {
    local_28 = (Table *)0x0;
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3SrcListLookup(Parse *pParse, SrcList *pSrc){
  struct SrcList_item *pItem = pSrc->a;
  Table *pTab;
  assert( pItem && pSrc->nSrc==1 );
  pTab = sqlite3LocateTableItem(pParse, 0, pItem);
  sqlite3DeleteTable(pParse->db, pItem->pTab);
  pItem->pTab = pTab;
  if( pTab ){
    pTab->nTabRef++;
  }
  if( sqlite3IndexedByLookup(pParse, pItem) ){
    pTab = 0;
  }
  return pTab;
}